

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O2

string * __thiscall
gflags::DescribeOneFlag_abi_cxx11_
          (string *__return_storage_ptr__,gflags *this,CommandLineFlagInfo *flag)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char cVar9;
  _Alloc_hider __s;
  allocator local_9d;
  int chars_in_line;
  CommandLineFlagInfo *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string main_part;
  
  main_part._M_dataplus._M_p = (pointer)&main_part.field_2;
  main_part._M_string_length = 0;
  main_part.field_2._M_local_buf[0] = '\0';
  local_98 = (CommandLineFlagInfo *)this;
  SStringPrintf(&main_part,"    -%s (%s)",*(undefined8 *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  chars_in_line = 0;
  iVar1 = 0;
  __s._M_p = main_part._M_dataplus._M_p;
  iVar4 = (int)main_part._M_string_length;
  do {
    sVar2 = strlen(__s._M_p);
    if (sVar2 != (long)iVar4) {
      __assert_fail("static_cast<size_t>(chars_left) == strlen(c_string)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags_reporting.cc"
                    ,0x82,"string gflags::DescribeOneFlag(const CommandLineFlagInfo &)");
    }
    pcVar3 = strchr(__s._M_p,10);
    if (pcVar3 == (char *)0x0) {
      if (iVar1 + iVar4 < 0x50) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        chars_in_line = iVar1 + iVar4;
        goto LAB_0010fa79;
      }
LAB_0010f9b3:
      uVar6 = (ulong)(0x4f - iVar1);
      uVar8 = (ulong)(0x4e - iVar1);
      while( true ) {
        uVar5 = (uint)uVar6;
        if ((int)uVar5 < 1) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          chars_in_line = 0x50;
          goto LAB_0010fa79;
        }
        iVar1 = isspace((int)__s._M_p[uVar6]);
        if (iVar1 != 0) break;
        uVar6 = uVar6 - 1;
        uVar8 = uVar8 - 1;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,__s._M_p,__s._M_p + (uVar5 & 0x7fffffff));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_90);
      chars_in_line = chars_in_line + uVar5;
      do {
        cVar9 = __s._M_p[uVar8 + 1];
        iVar1 = isspace((int)cVar9);
        uVar8 = uVar8 + 1;
      } while (iVar1 != 0);
    }
    else {
      if ((long)(ulong)(0x50 - iVar1) <= (long)pcVar3 - (long)__s._M_p) goto LAB_0010f9b3;
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)__s._M_p);
      lVar7 = (long)(int)((long)pcVar3 - (long)__s._M_p);
      cVar9 = __s._M_p[lVar7 + 1];
      uVar8 = lVar7 + 1;
    }
    if (cVar9 == '\0') {
LAB_0010fa79:
      std::__cxx11::string::string((string *)&local_70,"type: ",&local_9d);
      std::operator+(&local_90,&local_70,&local_98->type);
      AddString(&local_90,__return_storage_ptr__,&chars_in_line);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::string((string *)&local_70,"default",&local_9d);
      PrintStringFlagsWithQuotes(&local_90,local_98,&local_70,false);
      AddString(&local_90,__return_storage_ptr__,&chars_in_line);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      if (local_98->is_default == false) {
        std::__cxx11::string::string((string *)&local_70,"currently",&local_9d);
        PrintStringFlagsWithQuotes(&local_90,local_98,&local_70,true);
        AddString(&local_90,__return_storage_ptr__,&chars_in_line);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
      }
      StringAppendF(__return_storage_ptr__,"\n");
      std::__cxx11::string::~string((string *)&main_part);
      return __return_storage_ptr__;
    }
    StringAppendF(__return_storage_ptr__,"\n      ");
    iVar4 = iVar4 - (int)uVar8;
    __s._M_p = __s._M_p + uVar8;
    chars_in_line = 6;
    iVar1 = 6;
  } while( true );
}

Assistant:

static string DescribeOneFlagInXML(const CommandLineFlagInfo& flag) {
  // The file and flagname could have been attributes, but default
  // and meaning need to avoid attribute normalization.  This way it
  // can be parsed by simple programs, in addition to xml parsers.
  string r("<flag>");
  AddXMLTag(&r, "file", flag.filename);
  AddXMLTag(&r, "name", flag.name);
  AddXMLTag(&r, "meaning", flag.description);
  AddXMLTag(&r, "default", flag.default_value);
  AddXMLTag(&r, "current", flag.current_value);
  AddXMLTag(&r, "type", flag.type);
  r += "</flag>";
  return r;
}